

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_algo_struct.c
# Opt level: O0

void histprune_report(histprune_t *h)

{
  histprune_t *h_local;
  
  err_msg(ERR_INFO,(char *)0x0,0,"Initialization of histprune_t, report:\n");
  err_msg(ERR_INFO,(char *)0x0,0,"Parameters used in histogram pruning:\n");
  err_msg(ERR_INFO,(char *)0x0,0,"Max.     HMM per frame=%d\n",(ulong)(uint)h->maxhmmpf);
  err_msg(ERR_INFO,(char *)0x0,0,"Max. history per frame=%d\n",(ulong)(uint)h->maxhistpf);
  err_msg(ERR_INFO,(char *)0x0,0,"Max.    word per frame=%d\n",(ulong)(uint)h->maxwpf);
  err_msg(ERR_INFO,(char *)0x0,0,"Size of histogram  bin=%d\n",(ulong)(uint)h->hmm_hist_binsize);
  err_msg(ERR_INFO,(char *)0x0,0,"No.  of histogram  bin=%d\n",(ulong)(uint)h->hmm_hist_bins);
  err_msg(ERR_INFO,(char *)0x0,0,"\n");
  return;
}

Assistant:

void
histprune_report(histprune_t * h)
{
    E_INFO_NOFN("Initialization of histprune_t, report:\n");
    E_INFO_NOFN("Parameters used in histogram pruning:\n");
    E_INFO_NOFN("Max.     HMM per frame=%d\n", h->maxhmmpf);
    E_INFO_NOFN("Max. history per frame=%d\n", h->maxhistpf);
    E_INFO_NOFN("Max.    word per frame=%d\n", h->maxwpf);
    E_INFO_NOFN("Size of histogram  bin=%d\n", h->hmm_hist_binsize);
    E_INFO_NOFN("No.  of histogram  bin=%d\n", h->hmm_hist_bins);
    E_INFO_NOFN("\n");
}